

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

bool google::anon_unknown_1::TryParseLocked
               (CommandLineFlag *flag,FlagValue *flag_value,char *value,string *msg)

{
  FlagValue *pFVar1;
  string *psVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  FlagValue local_88 [48];
  FlagValue local_58 [32];
  FlagValue *local_38;
  FlagValue *tentative_value;
  string *msg_local;
  char *value_local;
  FlagValue *flag_value_local;
  CommandLineFlag *flag_local;
  
  tentative_value = (FlagValue *)msg;
  msg_local = (string *)value;
  value_local = (char *)flag_value;
  flag_value_local = (FlagValue *)flag;
  local_38 = FlagValue::New(flag_value);
  bVar3 = FlagValue::ParseFrom(local_38,(char *)msg_local);
  psVar2 = msg_local;
  pFVar1 = tentative_value;
  if (bVar3) {
    bVar3 = CommandLineFlag::Validate((CommandLineFlag *)flag_value_local,local_38);
    pFVar1 = tentative_value;
    if (bVar3) {
      FlagValue::CopyFrom((FlagValue *)value_local,local_38);
      pFVar1 = tentative_value;
      if (tentative_value != (FlagValue *)0x0) {
        pcVar4 = CommandLineFlag::name((CommandLineFlag *)flag_value_local);
        (anonymous_namespace)::FlagValue::ToString_abi_cxx11_(local_88);
        uVar6 = std::__cxx11::string::c_str();
        StringAppendF((string *)pFVar1,"%s set to %s\n",pcVar4,uVar6);
        std::__cxx11::string::~string((string *)local_88);
      }
      pFVar1 = local_38;
      if (local_38 != (FlagValue *)0x0) {
        FlagValue::~FlagValue(local_38);
        operator_delete(pFVar1);
      }
      flag_local._7_1_ = true;
    }
    else {
      if (tentative_value != (FlagValue *)0x0) {
        (anonymous_namespace)::FlagValue::ToString_abi_cxx11_(local_58);
        uVar6 = std::__cxx11::string::c_str();
        pcVar4 = CommandLineFlag::name((CommandLineFlag *)flag_value_local);
        StringAppendF((string *)pFVar1,"%sfailed validation of new value \'%s\' for flag \'%s\'\n",
                      "ERROR: ",uVar6,pcVar4);
        std::__cxx11::string::~string((string *)local_58);
      }
      pFVar1 = local_38;
      if (local_38 != (FlagValue *)0x0) {
        FlagValue::~FlagValue(local_38);
        operator_delete(pFVar1);
      }
      flag_local._7_1_ = false;
    }
  }
  else {
    if (tentative_value != (FlagValue *)0x0) {
      pcVar4 = CommandLineFlag::type_name((CommandLineFlag *)flag_value_local);
      pcVar5 = CommandLineFlag::name((CommandLineFlag *)flag_value_local);
      StringAppendF((string *)pFVar1,"%sillegal value \'%s\' specified for %s flag \'%s\'\n",
                    "ERROR: ",psVar2,pcVar4,pcVar5);
    }
    pFVar1 = local_38;
    if (local_38 != (FlagValue *)0x0) {
      FlagValue::~FlagValue(local_38);
      operator_delete(pFVar1);
    }
    flag_local._7_1_ = false;
  }
  return flag_local._7_1_;
}

Assistant:

bool TryParseLocked(const CommandLineFlag* flag, FlagValue* flag_value,
                    const char* value, string* msg) {
  // Use tenative_value, not flag_value, until we know value is valid.
  FlagValue* tentative_value = flag_value->New();
  if (!tentative_value->ParseFrom(value)) {
    if (msg) {
      StringAppendF(msg,
                    "%sillegal value '%s' specified for %s flag '%s'\n",
                    kError, value,
                    flag->type_name(), flag->name());
    }
    delete tentative_value;
    return false;
  } else if (!flag->Validate(*tentative_value)) {
    if (msg) {
      StringAppendF(msg,
          "%sfailed validation of new value '%s' for flag '%s'\n",
          kError, tentative_value->ToString().c_str(),
          flag->name());
    }
    delete tentative_value;
    return false;
  } else {
    flag_value->CopyFrom(*tentative_value);
    if (msg) {
      StringAppendF(msg, "%s set to %s\n",
                    flag->name(), flag_value->ToString().c_str());
    }
    delete tentative_value;
    return true;
  }
}